

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureCalc.h
# Opt level: O0

void __thiscall
GmmLib::GmmTextureCalc::GetMipTailGeometryOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel,uint32_t *OffsetX,
          uint32_t *OffsetY,uint32_t *OffsetZ)

{
  uint32_t *OffsetZ_local;
  uint32_t *OffsetY_local;
  uint32_t *OffsetX_local;
  uint32_t MipLevel_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  return;
}

Assistant:

virtual void    GetMipTailGeometryOffset(
                                GMM_TEXTURE_INFO *pTexInfo,
                                uint32_t            MipLevel,
                                uint32_t*           OffsetX,
                                uint32_t*           OffsetY,
                                uint32_t*           OffsetZ)
            {
                GMM_UNREFERENCED_PARAMETER(pTexInfo);
                GMM_UNREFERENCED_PARAMETER(MipLevel);
                GMM_UNREFERENCED_PARAMETER(OffsetX);
                GMM_UNREFERENCED_PARAMETER(OffsetY);
                GMM_UNREFERENCED_PARAMETER(OffsetZ);

                // Left empty
            }